

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
RefundIRCCommand::trigger
          (RefundIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  PlayerInfo *pPVar4;
  uint uVar5;
  double dVar6;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  split_parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  size_t local_c8;
  char *local_c0;
  IRC_Bot *local_b8;
  size_type local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  size_t local_88;
  char *local_80;
  char *local_78;
  size_t local_70;
  container_type local_68;
  string local_50;
  
  jessilib::
  word_split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
            (&local_68,parameters._M_str,parameters._M_str + parameters._M_len," \t","");
  if ((ulong)((long)local_68.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_68.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x11) {
    Jupiter::IRC::Client::sendNotice
              (source,nick._M_len,nick._M_str,0x3b,
               "Error: Too Few Parameters. Syntax: refund <player> <amount>");
  }
  else {
    local_c8 = nick._M_len;
    local_c0 = nick._M_str;
    local_b8 = source;
    lVar2 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
    if (lVar2 != 0) {
      Jupiter::IRC::Client::Channel::getType();
      local_70 = (local_68.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_len;
      local_78 = (local_68.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_str;
      local_88 = channel._M_len;
      local_80 = channel._M_str;
      dVar6 = (double)Jupiter_strtod_s(local_68.
                                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]._M_str,
                                       local_68.
                                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]._M_len);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      local_e8._M_string_length = 0;
      local_e8.field_2._M_local_buf[0] = '\0';
      uVar5 = 0;
      while( true ) {
        RenX::getCore();
        uVar3 = RenX::Core::getServerCount();
        if (uVar3 == uVar5) break;
        uVar3 = RenX::getCore();
        pPVar4 = (PlayerInfo *)RenX::Core::getServer(uVar3);
        cVar1 = RenX::Server::isLogChanType((int)pPVar4);
        if ((cVar1 != '\0') && (*(long *)((long)&(pPVar4->name).field_2 + 8) != 0)) {
          lVar2 = RenX::Server::getPlayerByPartName(pPVar4,local_70,local_78);
          if (lVar2 != 0) {
            cVar1 = RenX::Server::giveCredits(pPVar4,dVar6);
            if (cVar1 == '\0') {
              local_b0 = 0x27;
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
              local_a8._M_dataplus._M_p =
                   std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_create(&local_a8,&local_b0,0);
              local_a8.field_2._M_allocated_capacity = local_b0;
              builtin_strncpy(local_a8._M_dataplus._M_p,"Error: Server does not support refunds.",
                              0x27);
              local_a8._M_string_length = local_b0;
              local_a8._M_dataplus._M_p[local_b0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&local_e8,&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              string_printf_abi_cxx11_
                        (&local_a8,"You have been refunded %.0f credits by %.*s.",SUB84(dVar6,0),
                         local_c8,local_c0);
              trigger();
              RenX::Server::sendMessage
                        (pPVar4,lVar2,local_e8._M_string_length,local_e8._M_dataplus._M_p);
              string_printf_abi_cxx11_
                        (&local_50,"%.*s has been refunded %.0f credits.",SUB84(dVar6,0),
                         *(undefined8 *)(lVar2 + 0x10),*(undefined8 *)(lVar2 + 8));
              trigger();
            }
            Jupiter::IRC::Client::sendMessage
                      (local_b8,local_88,local_80,local_e8._M_string_length,
                       local_e8._M_dataplus._M_p);
          }
        }
        uVar5 = uVar5 + 1;
      }
      if (local_e8._M_string_length == 0) {
        Jupiter::IRC::Client::sendNotice(local_b8,local_c8,local_c0,0x18,"Error: Player not found.")
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,
                        CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                 local_e8.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if (local_68.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void RefundIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	std::vector<std::string_view> split_parameters = jessilib::word_split_view(std::string_view{parameters}, WHITESPACE_SV);
	if (split_parameters.size() >= 2) {
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr) {
			int type = chan->getType();
			std::string_view playerName = split_parameters[0];
			double credits = Jupiter::asDouble(split_parameters[1]);
			RenX::PlayerInfo *player;
			std::string msg;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type) && server->players.size() != 0) {
					player = server->getPlayerByPartName(playerName);
					if (player != nullptr) {
						if (server->giveCredits(*player, credits)) {
							msg = string_printf("You have been refunded %.0f credits by %.*s.", credits, nick.size(), nick.data());
							server->sendMessage(*player, msg);
							msg = string_printf("%.*s has been refunded %.0f credits.", player->name.size(), player->name.data(), credits);
						}
						else {
							msg = "Error: Server does not support refunds."s;
						}
						source->sendMessage(channel, msg);
					}
				}
			}
			if (msg.empty()) {
				source->sendNotice(nick, "Error: Player not found."sv);
			}
		}
	}
	else {
		source->sendNotice(nick, "Error: Too Few Parameters. Syntax: refund <player> <amount>"sv);
	}
}